

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCurl.cxx
# Opt level: O0

bool __thiscall cmCTestCurl::InitCurl(cmCTestCurl *this)

{
  Curl_easy *pCVar1;
  ulong uVar2;
  undefined8 uVar3;
  string local_38;
  cmCTestCurl *local_18;
  cmCTestCurl *this_local;
  
  if (this->Curl == (CURL *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    local_18 = this;
    cmCurlSetCAInfo_abi_cxx11_(&local_38,this->Curl,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_38);
    if ((this->VerifyPeerOff & 1U) != 0) {
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_SSL_VERIFYPEER,0);
    }
    if ((this->VerifyHostOff & 1U) != 0) {
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_SSL_VERIFYHOST,0);
    }
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      pCVar1 = (Curl_easy *)this->Curl;
      uVar3 = std::__cxx11::string::c_str();
      curl_easy_setopt(pCVar1,CURLOPT_PROXY,uVar3);
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_PROXYTYPE,(ulong)this->HTTPProxyType);
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        pCVar1 = (Curl_easy *)this->Curl;
        uVar3 = std::__cxx11::string::c_str();
        curl_easy_setopt(pCVar1,CURLOPT_PROXYUSERPWD,uVar3);
      }
    }
    if ((this->UseHttp10 & 1U) != 0) {
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_HTTP_VERSION,1);
    }
    curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_FAILONERROR,1);
    if (this->TimeOutSeconds != 0) {
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_LOW_SPEED_LIMIT,1);
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_LOW_SPEED_TIME,
                       (ulong)(uint)this->TimeOutSeconds);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool cmCTestCurl::InitCurl()
{
  if (!this->Curl) {
    return false;
  }
  cmCurlSetCAInfo(this->Curl);
  if (this->VerifyPeerOff) {
    curl_easy_setopt(this->Curl, CURLOPT_SSL_VERIFYPEER, 0);
  }
  if (this->VerifyHostOff) {
    curl_easy_setopt(this->Curl, CURLOPT_SSL_VERIFYHOST, 0);
  }
  if (!this->HTTPProxy.empty()) {
    curl_easy_setopt(this->Curl, CURLOPT_PROXY, this->HTTPProxy.c_str());
    curl_easy_setopt(this->Curl, CURLOPT_PROXYTYPE, this->HTTPProxyType);
    if (!this->HTTPProxyAuth.empty()) {
      curl_easy_setopt(this->Curl, CURLOPT_PROXYUSERPWD,
                       this->HTTPProxyAuth.c_str());
    }
  }
  if (this->UseHttp10) {
    curl_easy_setopt(this->Curl, CURLOPT_HTTP_VERSION, CURL_HTTP_VERSION_1_0);
  }
  // enable HTTP ERROR parsing
  curl_easy_setopt(this->Curl, CURLOPT_FAILONERROR, 1);

  // if there is little to no activity for too long stop submitting
  if (this->TimeOutSeconds) {
    curl_easy_setopt(this->Curl, CURLOPT_LOW_SPEED_LIMIT, 1);
    curl_easy_setopt(this->Curl, CURLOPT_LOW_SPEED_TIME, this->TimeOutSeconds);
  }

  return true;
}